

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O2

bool libaom_examples::double_to_depth_representation_element
               (double v,DepthRepresentationElement *element)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  byte bVar4;
  byte bVar5;
  double orig;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if ((v == 0.0) && (!NAN(v))) {
    element->sign_flag = false;
    element->exponent = '\0';
    element->mantissa_len = '\0';
    element->mantissa = 1;
    return true;
  }
  dVar6 = -v;
  dVar7 = dVar6;
  if (dVar6 <= v) {
    dVar7 = v;
  }
  iVar2 = 0;
  if (1.0 <= dVar7) {
    for (; 2.0 <= dVar7; dVar7 = dVar7 * 0.5) {
      iVar2 = iVar2 + 1;
    }
  }
  else {
    for (; dVar7 < 1.0; dVar7 = dVar7 + dVar7) {
      iVar2 = iVar2 + -1;
    }
  }
  if (iVar2 - 0x60U < 0xffffff82) {
    fprintf(_stderr,"Error: Floating point value %f out of range (too large or too small)\n");
    bVar1 = false;
  }
  else {
    dVar7 = dVar7 + -1.0;
    uVar3 = 0;
    bVar4 = 0;
    do {
      dVar8 = 0.5;
      if (0.5 > dVar7) {
        dVar8 = 0.0;
      }
      uVar3 = (uint)(0.5 <= dVar7) + uVar3 * 2;
      bVar5 = bVar4 + 1;
    } while ((bVar4 < 0x1f) &&
            (dVar7 = (dVar7 - dVar8) + (dVar7 - dVar8), bVar4 = bVar5, 0.0 < dVar7));
    element->sign_flag = v < dVar6;
    element->exponent = (char)iVar2 + '\x1f';
    element->mantissa_len = bVar5;
    element->mantissa = uVar3;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool double_to_depth_representation_element(
    double v, DepthRepresentationElement *element) {
  const double orig = v;
  if (v == 0.0) {
    *element = { 0, 0, 0, 1 };
    return true;
  }
  const bool sign = v < 0.0;
  if (sign) {
    v = -v;
  }
  int exp = 0;
  if (v >= 1.0) {
    while (v >= 2.0) {
      ++exp;
      v /= 2;
    }
  } else {
    while (v < 1.0) {
      ++exp;
      v *= 2.0;
    }
    exp = -exp;
  }
  if ((exp + 31) <= 0 || (exp + 31) > 126) {
    fprintf(stderr,
            "Error: Floating point value %f out of range (too large or too "
            "small)\n",
            orig);
    return false;
  }
  assert(v >= 1.0 && v < 2.0);
  v -= 1.0;
  uint32_t mantissa = 0;
  uint8_t mantissa_len = 0;
  constexpr uint8_t kMaxMantissaLen = 32;
  do {
    const int bit = (v >= 0.5);
    mantissa = (mantissa << 1) + bit;
    v -= bit * 0.5;
    ++mantissa_len;
    v *= 2.0;
  } while (mantissa_len < kMaxMantissaLen && v > 0.0);
  *element = { sign, static_cast<uint8_t>(exp + 31), mantissa_len, mantissa };
  return true;
}